

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::
NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>(string_view data,size_t extra)

{
  CordRepBtree *pCVar1;
  CordRep *this;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  size_t in_R8;
  char *dst;
  string_view s;
  
  lVar4 = 0;
  pCVar1 = New(0);
  pcVar3 = (char *)0x0;
  while( true ) {
    dst = (char *)data._M_len;
    if ((dst == (char *)0x0) || (lVar4 == 6)) break;
    this = &CordRepFlat::NewImpl<4096ul>((size_t)(dst + extra))->super_CordRep;
    pcVar2 = (char *)CordRepFlat::Capacity((CordRepFlat *)this);
    if (dst <= pcVar2) {
      pcVar2 = dst;
    }
    this->length = (size_t)pcVar2;
    pcVar3 = pcVar3 + (long)pcVar2;
    pCVar1->edges_[lVar4] = this;
    lVar4 = lVar4 + 1;
    s._M_str = pcVar2;
    s._M_len = (size_t)data._M_str;
    data = anon_unknown_0::Consume<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                     ((anon_unknown_0 *)this->storage,dst,s,in_R8);
  }
  (pCVar1->super_CordRep).length = (size_t)pcVar3;
  (pCVar1->super_CordRep).storage[2] = (uint8_t)lVar4;
  return pCVar1;
}

Assistant:

CordRepBtree* CordRepBtree::NewLeaf<kBack>(absl::string_view data,
                                           size_t extra) {
  CordRepBtree* leaf = CordRepBtree::New(0);
  size_t length = 0;
  size_t end = 0;
  const size_t cap = leaf->capacity();
  while (!data.empty() && end != cap) {
    auto* flat = CordRepFlat::New(data.length() + extra);
    flat->length = (std::min)(data.length(), flat->Capacity());
    length += flat->length;
    leaf->edges_[end++] = flat;
    data = Consume<kBack>(flat->Data(), data, flat->length);
  }
  leaf->length = length;
  leaf->set_end(end);
  return leaf;
}